

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::struct_init(Parser *this)

{
  vector<ID_table_t,_std::allocator<ID_table_t>_> *this_00;
  pointer pIVar1;
  pointer pIVar2;
  pointer pLVar3;
  ID_table_t *this_01;
  lex_t lVar4;
  int iVar5;
  iterator this_02;
  iterator iVar6;
  ostream *poVar7;
  ID *this_03;
  pointer this_04;
  
  this_02 = ID_table_t::get_begin
                      ((this->ID_tables_vec->
                       super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  iVar6 = ID_table_t::get_end((this->ID_tables_vec->
                              super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>)._M_impl.
                              super__Vector_impl_data._M_start);
  for (; this_02._M_current != iVar6._M_current; this_02._M_current = this_02._M_current + 1) {
    lVar4 = ID::get_type(this_02._M_current);
    if (lVar4 == LEX_STRUCT) {
      this_00 = this->ID_tables_vec;
      pIVar1 = (this_00->super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pIVar2 = (this_00->super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = ID::get_value(this_02._M_current);
      std::vector<ID_table_t,_std::allocator<ID_table_t>_>::push_back
                (this_00,(this_00->super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>).
                         _M_impl.super__Vector_impl_data._M_start + iVar5);
      ID::set_value(this_02._M_current,(int)(((long)pIVar1 - (long)pIVar2) / 0x18));
    }
  }
  if (DEBUG_MODE != 0) {
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  pLVar3 = (this->lex_vec->super__Vector_base<Lex,_std::allocator<Lex>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_04 = (this->lex_vec->super__Vector_base<Lex,_std::allocator<Lex>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_04 != pLVar3; this_04 = this_04 + 1) {
    iVar5 = Lex::get_add_value(this_04);
    if (iVar5 != 0) {
      this_01 = (this->ID_tables_vec->super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>).
                _M_impl.super__Vector_impl_data._M_start;
      iVar5 = Lex::get_add_value(this_04);
      this_03 = ID_table_t::operator[](this_01,iVar5);
      iVar5 = ID::get_value(this_03);
      Lex::set_add_value(this_04,iVar5);
    }
  }
  return;
}

Assistant:

void Parser::struct_init() {
    auto ptr = ID_tables_vec[0].get_begin();
    auto end = ID_tables_vec[0].get_end();
    int table_index;

    while(ptr != end){
        if(ptr->get_type() == LEX_STRUCT){
            table_index = (int) ID_tables_vec.size();
            ID_tables_vec.push_back(ID_tables_vec[ptr->get_value()]);
            ptr->set_value(table_index);
        }
        ++ptr;
    }

    if (DEBUG_MODE)
        cout << endl << endl;
    auto lex_ptr = lex_vec.begin();
    auto lex_end = lex_vec.end();
    while(lex_ptr != lex_end){
        if(lex_ptr->get_add_value() != 0){
            lex_ptr->set_add_value(ID_tables_vec[0][lex_ptr->get_add_value()].get_value());
        }
        ++lex_ptr;
    }

}